

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::ReshapeParameter::ByteSizeLong(ReshapeParameter *this)

{
  bool bVar1;
  int32 iVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  size_t sVar4;
  size_t sStack_38;
  int cached_size;
  size_t total_size;
  ReshapeParameter *this_local;
  
  sStack_38 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = ReshapeParameter::unknown_fields(this);
    sStack_38 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    bVar1 = has_shape(this);
    if (bVar1) {
      sVar4 = google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual<caffe::BlobShape>
                        (this->shape_);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_axis(this);
    if (bVar1) {
      iVar2 = axis(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
    bVar1 = has_num_axes(this);
    if (bVar1) {
      iVar2 = num_axes(this);
      sVar4 = google::protobuf::internal::WireFormatLite::Int32Size(iVar2);
      sStack_38 = sVar4 + 1 + sStack_38;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_38);
  this->_cached_size_ = iVar3;
  return sStack_38;
}

Assistant:

size_t ReshapeParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ReshapeParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 7u) {
    // optional .caffe.BlobShape shape = 1;
    if (has_shape()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *this->shape_);
    }

    // optional int32 axis = 2 [default = 0];
    if (has_axis()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->axis());
    }

    // optional int32 num_axes = 3 [default = -1];
    if (has_num_axes()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(
          this->num_axes());
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}